

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall QTextDocumentPrivate::compressPieceTable(QTextDocumentPrivate *this)

{
  uint uVar1;
  Data *pDVar2;
  Header *pHVar3;
  QTextFragmentData *pQVar4;
  uint n;
  char16_t *pcVar5;
  int iVar6;
  char16_t *__dest;
  long in_FS_OFFSET;
  double dVar7;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->undoEnabled == false) && (0xc000 < this->unreachableCharacterCount)) {
    pDVar2 = (this->text).d.d;
    if (pDVar2 == (Data *)0x0) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = (double)(pDVar2->super_QArrayData).alloc * 0.9;
    }
    if (dVar7 <= (double)(this->text).d.size) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      QString::resize((longlong)&local_58);
      if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
      }
      pHVar3 = (this->fragments).data.field_0.head;
      uVar1 = pHVar3->root;
      do {
        n = uVar1;
        if (n == 0) goto LAB_004dd9df;
        uVar1 = *(uint *)((long)pHVar3 + (ulong)n * 0x20 + 4);
      } while (uVar1 != 0);
      iVar6 = 0;
      __dest = local_58.d.ptr;
      do {
        pcVar5 = (this->text).d.ptr;
        if (pcVar5 == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QString::_empty;
        }
        pQVar4 = (this->fragments).data.field_0.fragments;
        memcpy(__dest,pcVar5 + pQVar4[n].stringPosition,
               (ulong)pQVar4[n].super_QFragment<1>.size_array[0] * 2);
        (this->fragments).data.field_0.fragments[n].stringPosition = iVar6;
        uVar1 = (this->fragments).data.field_0.fragments[n].super_QFragment<1>.size_array[0];
        __dest = __dest + uVar1;
        iVar6 = iVar6 + uVar1;
        n = QFragmentMapData<QTextFragmentData>::next(&(this->fragments).data,n);
      } while (n != 0);
LAB_004dd9df:
      QString::resize((longlong)&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        if ((1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
           (local_58.d.size < *(qsizetype *)((long)local_58.d.d + 8))) {
          QString::reallocData((longlong)&local_58,(AllocationOption)local_58.d.size);
        }
        if ((&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) &&
           (*(qsizetype *)((long)local_58.d.d + 8) != 0)) {
          *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
                    super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                    super_QFlagsStorage<QArrayData::ArrayOption>.i =
               (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
                     super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                     super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
        }
      }
      QString::operator=(&this->text,&local_58);
      this->unreachableCharacterCount = 0;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::compressPieceTable()
{
    if (undoEnabled)
        return;

    const uint garbageCollectionThreshold = 96 * 1024; // bytes

    //qDebug() << "unreachable bytes:" << unreachableCharacterCount * sizeof(QChar) << " -- limit" << garbageCollectionThreshold << "text size =" << text.size() << "capacity:" << text.capacity();

    bool compressTable = unreachableCharacterCount * sizeof(QChar) > garbageCollectionThreshold
                         && text.size() >= text.capacity() * 0.9;
    if (!compressTable)
        return;

    QString newText;
    newText.resize(text.size());
    QChar *newTextPtr = newText.data();
    int newLen = 0;

    for (FragmentMap::Iterator it = fragments.begin(); !it.atEnd(); ++it) {
        memcpy(newTextPtr, text.constData() + it->stringPosition, it->size_array[0] * sizeof(QChar));
        it->stringPosition = newLen;
        newTextPtr += it->size_array[0];
        newLen += it->size_array[0];
    }

    newText.resize(newLen);
    newText.squeeze();
    //qDebug() << "removed" << text.size() - newText.size() << "characters";
    text = newText;
    unreachableCharacterCount = 0;
}